

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::INC_AB(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  
  this->cycles = 6;
  uVar2 = GetWord(this);
  this->cycles = this->cycles - 1;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(uint)uVar2);
  this->cycles = this->cycles - 1;
  bVar1 = (char)iVar3 + 1;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)(uint)uVar2,(ulong)bVar1);
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps & 0x7d | bVar1 & 0x80;
  return;
}

Assistant:

void CPU::INC_AB()
{
    cycles = 6;
    uint16_t addr = GetWord(), result = ReadByte(addr) + 1;
    cycles--;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}